

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_casting.hpp
# Opt level: O1

bool duckdb::CSVCast::
     TemplatedTryCastDecimalVector<duckdb::TryCastToDecimalCommaSeparated,duckdb::hugeint_t>
               (CSVReaderOptions *options,Vector *input_vector,Vector *result_vector,idx_t count,
               CastParameters *parameters,uint8_t width,uint8_t scale,idx_t *line_error)

{
  bool all_converted;
  undefined1 local_72;
  uint8_t local_71;
  undefined8 local_70;
  CastParameters *local_68;
  uint8_t *local_60;
  uint8_t *local_58;
  undefined1 *local_50;
  idx_t *local_48;
  undefined8 *local_40;
  ValidityMask *local_38;
  
  local_72 = 1;
  local_71 = width;
  FlatVector::VerifyFlatVector(result_vector);
  local_38 = &result_vector->validity;
  local_40 = &local_70;
  local_70 = 0;
  local_58 = &scale;
  local_48 = line_error;
  local_68 = parameters;
  local_60 = &local_71;
  local_50 = &local_72;
  UnaryExecutor::
  ExecuteStandard<duckdb::string_t,duckdb::hugeint_t,duckdb::UnaryLambdaWrapper,duckdb::CSVCast::TemplatedTryCastDecimalVector<duckdb::TryCastToDecimalCommaSeparated,duckdb::hugeint_t>(duckdb::CSVReaderOptions_const&,duckdb::Vector&,duckdb::Vector&,unsigned_long,duckdb::CastParameters&,unsigned_char,unsigned_char,unsigned_long&)::_lambda(duckdb::string_t)_1_>
            (input_vector,result_vector,count,&local_68,false,CAN_THROW_RUNTIME_ERROR);
  return (bool)local_72;
}

Assistant:

static bool TemplatedTryCastDecimalVector(const CSVReaderOptions &options, Vector &input_vector,
	                                          Vector &result_vector, idx_t count, CastParameters &parameters,
	                                          uint8_t width, uint8_t scale, idx_t &line_error) {
		D_ASSERT(input_vector.GetType().id() == LogicalTypeId::VARCHAR);
		bool all_converted = true;
		auto &validity_mask = FlatVector::Validity(result_vector);
		idx_t cur_line = 0;
		UnaryExecutor::Execute<string_t, T>(input_vector, result_vector, count, [&](string_t input) {
			T result;
			if (!OP::Operation(input, result, parameters, width, scale)) {
				if (all_converted) {
					line_error = cur_line;
				}
				validity_mask.SetInvalid(cur_line);
				all_converted = false;
				cur_line++;
			} else {
				cur_line++;
			}
			return result;
		});
		return all_converted;
	}